

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::MedianAbsoluteDeviationOperation<float>>
               (float *idata,AggregateInputData *aggr_input_data,
               QuantileState<float,_duckdb::QuantileStandardType> *state,idx_t count,
               ValidityMask *mask,SelectionVector *sel_vector)

{
  sel_t *psVar1;
  bool bVar2;
  idx_t i;
  idx_t iVar3;
  ulong uVar4;
  AggregateUnaryInput local_48;
  
  psVar1 = sel_vector->sel_vector;
  local_48.input = aggr_input_data;
  local_48.input_mask = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      local_48.input_idx = uVar4;
      if (psVar1 != (sel_t *)0x0) {
        local_48.input_idx = (idx_t)psVar1[uVar4];
      }
      QuantileOperation::
      Operation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<float>>
                (state,idata + local_48.input_idx,&local_48);
    }
  }
  else {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      local_48.input_idx = iVar3;
      if (psVar1 != (sel_t *)0x0) {
        local_48.input_idx = (idx_t)psVar1[iVar3];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,local_48.input_idx);
      if (bVar2) {
        QuantileOperation::
        Operation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<float>>
                  (state,idata + local_48.input_idx,&local_48);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}